

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickpool.hpp
# Opt level: O3

RingBuffer<std::function<void_()>_*> * __thiscall
quickpool::sched::RingBuffer<std::function<void_()>_*>::enlarged_copy
          (RingBuffer<std::function<void_()>_*> *this,size_t bottom,size_t top)

{
  _Head_base<0UL,_std::function<void_()>_**,_false> _Var1;
  ulong uVar2;
  ulong uVar3;
  RingBuffer<std::function<void_()>_*> *pRVar4;
  _Head_base<0UL,_std::function<void_()>_**,_false> _Var5;
  size_t i;
  
  pRVar4 = (RingBuffer<std::function<void_()>_*> *)operator_new(0x18);
  uVar3 = this->capacity_ * 2;
  _Var5._M_head_impl =
       (function<void_()> **)operator_new__(-(ulong)(uVar3 >> 0x3d != 0) | this->capacity_ << 4);
  (pRVar4->buffer_)._M_t.
  super___uniq_ptr_impl<std::function<void_()>_*,_std::default_delete<std::function<void_()>_*[]>_>.
  _M_t.
  super__Tuple_impl<0UL,_std::function<void_()>_**,_std::default_delete<std::function<void_()>_*[]>_>
  .super__Head_base<0UL,_std::function<void_()>_**,_false>._M_head_impl = _Var5._M_head_impl;
  pRVar4->capacity_ = uVar3;
  pRVar4->mask_ = uVar3 - 1;
  if (top != bottom) {
    _Var1._M_head_impl =
         (this->buffer_)._M_t.
         super___uniq_ptr_impl<std::function<void_()>_*,_std::default_delete<std::function<void_()>_*[]>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::function<void_()>_**,_std::default_delete<std::function<void_()>_*[]>_>
         .super__Head_base<0UL,_std::function<void_()>_**,_false>._M_head_impl;
    uVar2 = this->mask_;
    do {
      _Var5._M_head_impl[top & uVar3 - 1] = _Var1._M_head_impl[uVar2 & top];
      top = top + 1;
    } while (bottom != top);
  }
  return pRVar4;
}

Assistant:

RingBuffer<T>* enlarged_copy(size_t bottom, size_t top) const
    {
        RingBuffer<T>* new_buffer = new RingBuffer{ 2 * capacity_ };
        for (size_t i = top; i != bottom; ++i)
            new_buffer->set_entry(i, this->get_entry(i));
        return new_buffer;
    }